

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

FindInfo absl::lts_20240722::container_internal::find_first_non_full<void>
                   (CommonFields *common,size_t hash)

{
  FindInfo FVar1;
  bool bVar2;
  ctrl_t *ctrl_00;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  ctrl_t *pos;
  uint local_bc;
  unsigned_short local_9a;
  undefined1 local_98 [6];
  NonIterableBitMask<unsigned_short,_16,_0> mask;
  GroupFullEmptyOrDeleted g;
  ctrl_t *ctrl;
  probe_seq<16UL> seq;
  size_t hash_local;
  CommonFields *common_local;
  char *local_48;
  NonIterableBitMask<unsigned_short,_16,_0> local_a;
  
  seq.index_ = hash;
  probe((probe_seq<16UL> *)&ctrl,common,hash);
  ctrl_00 = CommonFields::control(common);
  sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
  bVar2 = IsEmptyOrDeleted(ctrl_00[sVar3]);
  if (bVar2) {
    sVar3 = CommonFields::capacity(common);
    bVar2 = ShouldInsertBackwardsForDebug(sVar3,seq.index_,ctrl_00);
    if (!bVar2) {
      common_local = (CommonFields *)probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
      local_48 = (char *)0x0;
      goto LAB_00108290;
    }
  }
  while( true ) {
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
    pos = ctrl_00 + sVar3;
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_98,pos);
    local_9a = (unsigned_short)GroupSse2Impl::MaskEmptyOrDeleted((GroupSse2Impl *)local_98);
    bVar2 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)&local_9a);
    local_a.mask_ = local_9a;
    if (bVar2) break;
    probe_seq<16UL>::next((probe_seq<16UL> *)&ctrl);
    pcVar4 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,pos,__c_00);
    pcVar5 = (char *)CommonFields::capacity(common);
    if (pcVar5 < pcVar4) {
      __assert_fail("seq.index() <= common.capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x6ec,
                    "FindInfo absl::container_internal::find_first_non_full(const CommonFields &, size_t)"
                   );
    }
  }
  sVar3 = CommonFields::capacity(common);
  bVar2 = ShouldInsertBackwardsForDebug(sVar3,seq.index_,ctrl_00);
  if (bVar2) {
    local_bc = NonIterableBitMask<unsigned_short,_16,_0>::HighestBitSet(&local_a);
  }
  else {
    local_bc = NonIterableBitMask<unsigned_short,_16,_0>::LowestBitSet(&local_a);
  }
  pcVar4 = (char *)(ulong)local_bc;
  common_local = (CommonFields *)probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(size_t)pcVar4);
  local_48 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,pcVar4,__c);
LAB_00108290:
  FVar1.probe_length = (size_t)local_48;
  FVar1.offset = (size_t)common_local;
  return FVar1;
}

Assistant:

inline FindInfo find_first_non_full(const CommonFields& common, size_t hash) {
  auto seq = probe(common, hash);
  const ctrl_t* ctrl = common.control();
  if (IsEmptyOrDeleted(ctrl[seq.offset()]) &&
      !ShouldInsertBackwards(common.capacity(), hash, ctrl)) {
    return {seq.offset(), /*probe_length=*/0};
  }
  while (true) {
    GroupFullEmptyOrDeleted g{ctrl + seq.offset()};
    auto mask = g.MaskEmptyOrDeleted();
    if (mask) {
      return {
          seq.offset(GetInsertionOffset(mask, common.capacity(), hash, ctrl)),
          seq.index()};
    }
    seq.next();
    assert(seq.index() <= common.capacity() && "full table!");
  }
}